

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_functional_test.cxx
# Opt level: O0

vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
* gen_kern_vector<double,ExchCXX::Kernel,double,ExchCXX::Kernel>
            (Backend backend,Spin polar,double *args,Kernel *args_1,double *args_2,Kernel *args_3)

{
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  *in_RDI;
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  vec;
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  *this;
  Kernel kern;
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  *in_stack_ffffffffffffffb0;
  Spin in_stack_ffffffffffffffb8;
  Backend in_stack_ffffffffffffffbc;
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  *in_stack_ffffffffffffffc0;
  
  kern = (Kernel)((ulong)&stack0xffffffffffffffc0 >> 0x20);
  this = in_RDI;
  std::
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ::vector((vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
            *)0x17a640);
  gen_kern_vector<double,ExchCXX::Kernel>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
             (double)in_stack_ffffffffffffffb0,kern,(double *)this,(Kernel *)in_RDI);
  std::
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ::vector(this,in_RDI);
  std::
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ::~vector(in_stack_ffffffffffffffb0);
  return this;
}

Assistant:

auto gen_kern_vector( Backend backend, Spin polar, Args&&... args ) {
  std::vector< std::pair<double, XCKernel> > vec;
  gen_kern_vector( vec, backend, polar, std::forward<Args>(args)... );
  return vec;
}